

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

void Gia_ManInsertOne(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNew)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int local_30;
  int local_2c;
  int k;
  int i;
  Abc_Obj_t *pBox;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNew_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkHasMapping(pNtk);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x1fa,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkHasMapping(pNew);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasMapping(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x1fb,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  for (local_2c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkPi(pNtk,local_2c);
    if (((pAVar2->field_6).pTemp != (void *)0x0) &&
       (pAVar3 = Abc_ObjNtk((pAVar2->field_6).pCopy), pAVar3 != pNew)) {
      __assert_fail("!pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                    ,0x1fe,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkBox(pNtk,local_2c);
    for (local_30 = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_30 < iVar1; local_30 = local_30 + 1)
    {
      pAVar5 = Abc_ObjFanout(pAVar2,local_30);
      pAVar3 = Abc_ObjModel(pAVar2);
      pAVar4 = Abc_NtkPo(pAVar3,local_30);
      pAVar5->field_6 = pAVar4->field_6;
      if (((pAVar5->field_6).pTemp != (void *)0x0) &&
         (pAVar3 = Abc_ObjNtk((pAVar5->field_6).pCopy), pAVar3 != pNew)) {
        __assert_fail("!pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                      ,0x204,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkObj(pNtk,local_2c);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
      Abc_NtkDeleteObj(pAVar2);
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkBox(pNtk,local_2c);
    for (local_30 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_30 < iVar1; local_30 = local_30 + 1) {
      pAVar5 = Abc_ObjFanin(pAVar2,local_30);
      iVar1 = Abc_ObjFaninNum(pAVar5);
      if (iVar1 == 0) {
        pAVar3 = Abc_ObjModel(pAVar2);
        pAVar4 = Abc_NtkPi(pAVar3,local_30);
        pAVar4 = Gia_ManInsertOne_rec(pNtk,pNew,(pAVar4->field_6).pCopy);
        Abc_ObjAddFanin(pAVar5,pAVar4);
      }
    }
  }
  for (local_2c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkPo(pNtk,local_2c);
    iVar1 = Abc_ObjFaninNum(pAVar2);
    if (iVar1 == 0) {
      pAVar5 = Gia_ManInsertOne_rec(pNtk,pNew,(pAVar2->field_6).pCopy);
      Abc_ObjAddFanin(pAVar2,pAVar5);
    }
  }
  pNtk->pManFunc = pNew->pManFunc;
  pNtk->ntkFunc = pNew->ntkFunc;
  iVar1 = Abc_NtkHasMapping(pNtk);
  if (iVar1 != 0) {
    return;
  }
  __assert_fail("Abc_NtkHasMapping(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                ,0x215,"void Gia_ManInsertOne(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Gia_ManInsertOne( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNew )
{
    Abc_Obj_t * pObj, * pBox;  int i, k;
    assert( !Abc_NtkHasMapping(pNtk) );
    assert( Abc_NtkHasMapping(pNew) );
    // check that PIs point to barbufs
    Abc_NtkForEachPi( pNtk, pObj, i )
        assert( !pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew );
    // make barbufs point to box outputs
    Abc_NtkForEachBox( pNtk, pBox, i )
        Abc_ObjForEachFanout( pBox, pObj, k )
        {
            pObj->pCopy = Abc_NtkPo(Abc_ObjModel(pBox), k)->pCopy;
            assert( !pObj->pCopy || Abc_ObjNtk(pObj->pCopy) == pNew );
        }
    // remove internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_NtkDeleteObj( pObj );
    // start traversal from box inputs
    Abc_NtkForEachBox( pNtk, pBox, i )
        Abc_ObjForEachFanin( pBox, pObj, k )
            if ( Abc_ObjFaninNum(pObj) == 0 )
                Abc_ObjAddFanin( pObj, Gia_ManInsertOne_rec(pNtk, pNew, Abc_NtkPi(Abc_ObjModel(pBox), k)->pCopy) );
    // start traversal from primary outputs
    Abc_NtkForEachPo( pNtk, pObj, i )
        if ( Abc_ObjFaninNum(pObj) == 0 )
            Abc_ObjAddFanin( pObj, Gia_ManInsertOne_rec(pNtk, pNew, pObj->pCopy) );
    // update the functionality manager
    pNtk->pManFunc = pNew->pManFunc;
    pNtk->ntkFunc  = pNew->ntkFunc;
    assert( Abc_NtkHasMapping(pNtk) );
}